

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.h
# Opt level: O2

void __thiscall
Js::InterpreterStackFrame::
OP_CallI<Js::OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout)

{
  Var target;
  RecyclableObject *function;
  
  target = GetRegAllowStackVar<unsigned_int>(this,playout->Function);
  function = OP_CallGetFunc(this,target);
  OP_CallCommon<Js::OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
            (this,playout,function,0,(AuxArray<unsigned_int> *)0x0);
  return;
}

Assistant:

void OP_CallI(const unaligned T* playout) { OP_CallCommon(playout, OP_CallGetFunc(GetRegAllowStackVar(playout->Function)), Js::CallFlags_None); }